

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

int kyber_parse_public_key_no_hash(public_key *pub,CBS *in)

{
  int iVar1;
  int iVar2;
  CBS t_bytes;
  
  iVar1 = CBS_get_bytes(in,&t_bytes,0x480);
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = vector_decode(&pub->t,t_bytes.data,0xc);
    if (iVar1 != 0) {
      iVar1 = CBS_copy_bytes(in,pub->rho,0x20);
      iVar2 = 0;
      if (iVar1 != 0) {
        matrix_expand(&pub->m,pub->rho);
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int kyber_parse_public_key_no_hash(struct public_key *pub, CBS *in) {
  CBS t_bytes;
  if (!CBS_get_bytes(in, &t_bytes, kEncodedVectorSize) ||
      !vector_decode(&pub->t, CBS_data(&t_bytes), kLog2Prime) ||
      !CBS_copy_bytes(in, pub->rho, sizeof(pub->rho))) {
    return 0;
  }
  matrix_expand(&pub->m, pub->rho);
  return 1;
}